

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::
emplaceRealloc<slang::ast::PrimitiveSymbol::TableEntry>
          (SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *this,pointer pos,
          TableEntry *args)

{
  size_type sVar1;
  size_t sVar2;
  size_type sVar3;
  size_type sVar4;
  iterator pTVar5;
  long lVar6;
  pointer pTVar7;
  pointer pTVar8;
  iterator __result;
  size_t *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  TableEntry *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar3 = max_size((SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *)0x4a165b);
  if (sVar1 == sVar3) {
    detail::throwLengthError();
  }
  sVar4 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pTVar5 = begin(in_RDI);
  lVar6 = (long)__last - (long)pTVar5;
  pTVar7 = (pointer)operator_new(0x4a16bd);
  pTVar8 = pTVar7 + lVar6 / 0x18;
  (pTVar8->inputs)._M_len = *in_RDX;
  (pTVar8->inputs)._M_str = (char *)in_RDX[1];
  sVar2 = in_RDX[2];
  pTVar8->state = (char)sVar2;
  pTVar8->output = (char)(sVar2 >> 8);
  pTVar8->isEdgeSensitive = (bool)(char)(sVar2 >> 0x10);
  *(int5 *)&pTVar8->field_0x13 = (int5)(sVar2 >> 0x18);
  pTVar5 = end(in_RDI);
  if (in_RSI == pTVar5) {
    __result = begin(in_RDI);
    pTVar5 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::PrimitiveSymbol::TableEntry*,slang::ast::PrimitiveSymbol::TableEntry*>
              (in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::ast::PrimitiveSymbol::TableEntry*,slang::ast::PrimitiveSymbol::TableEntry*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pTVar5 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::PrimitiveSymbol::TableEntry*,slang::ast::PrimitiveSymbol::TableEntry*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pTVar5);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar4;
  in_RDI->data_ = pTVar7;
  return pTVar8;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}